

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O2

void __thiscall kratos::SwitchStmt::set_target(SwitchStmt *this,shared_ptr<kratos::Var> *target)

{
  element_type *peVar1;
  uint32_t width;
  int iVar2;
  undefined1 local_48 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  (*(((this->target_stmt_).super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr
     )->super_Stmt).super_IRNode._vptr_IRNode[0xc])();
  std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->target_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>,
             &target->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>);
  width = (*(((target->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            super_IRNode)._vptr_IRNode[0xd])();
  iVar2 = (*(((target->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            super_IRNode)._vptr_IRNode[7])();
  Generator::get_auxiliary_var((Generator *)(local_48 + 0x10),width,SUB41(iVar2,0));
  Var::assign((Var *)local_48,(shared_ptr<kratos::Var> *)local_48._16_8_);
  std::__shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->target_stmt_).
              super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2> *)local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  peVar1 = (this->target_stmt_).super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*(peVar1->super_Stmt).super_IRNode._vptr_IRNode[7])(peVar1,this);
  return;
}

Assistant:

void SwitchStmt::set_target(const std::shared_ptr<Var> &target) {
    target_stmt_->clear();
    target_ = target;
    target_stmt_ = target->generator()->get_auxiliary_var(target->width())->assign(target);
    target_stmt_->set_parent(this);
}